

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O3

void __thiscall QStyleOptionSlider::QStyleOptionSlider(QStyleOptionSlider *this,int version)

{
  QStyleOption::QStyleOption((QStyleOption *)this,version,0xf0001);
  (this->super_QStyleOptionComplex).subControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff;
  (this->super_QStyleOptionComplex).activeSubControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  this->orientation = Horizontal;
  (this->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = 0;
  this->minimum = 0;
  this->maximum = 0;
  this->tickPosition = NoTicks;
  this->tickInterval = 0;
  this->upsideDown = false;
  this->sliderPosition = 0;
  this->sliderValue = 0;
  this->singleStep = 0;
  this->pageStep = 0;
  *(undefined8 *)((long)&this->singleStep + 1) = 0;
  *(undefined8 *)((long)&this->notchTarget + 1) = 0;
  return;
}

Assistant:

QStyleOptionSlider::QStyleOptionSlider(int version)
    : QStyleOptionComplex(version, SO_Slider), orientation(Qt::Horizontal), minimum(0), maximum(0),
      tickPosition(QSlider::NoTicks), tickInterval(0), upsideDown(false),
      sliderPosition(0), sliderValue(0), singleStep(0), pageStep(0), notchTarget(0.0),
      dialWrapping(false), keyboardModifiers{}
{
}